

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

MPP_RET mpp_buf_slot_ready(MppBufSlots slots)

{
  long lVar1;
  int iVar2;
  MPP_RET MVar3;
  void *pvVar4;
  AutoMutex auto_lock;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_ready");
    MVar3 = MPP_ERR_NULL_PTR;
  }
  else {
    if (((byte)buf_slot_debug & 2) != 0) {
      _mpp_log_l(4,"mpp_buf_slot","slot %p is ready now\n",(char *)0x0,slots);
    }
    auto_lock.mLock = *slots;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    if (*(long *)((long)slots + 0xe8) == 0) {
      _dump_slots("mpp_buf_slot_ready",(MppBufSlotsImpl *)slots);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->slots",
                 "mpp_buf_slot_ready",0x3b4);
LAB_0012d96d:
      abort();
    }
    if (*(int *)((long)slots + 0x18) == 0) {
      _mpp_log_l(4,"mpp_buf_slot","found info change ready set without internal info change\n",
                 (char *)0x0);
    }
    iVar2 = *(int *)((long)slots + 0x60);
    if (iVar2 != *(int *)((long)slots + 0x20)) {
      pvVar4 = mpp_osal_realloc("mpp_buf_slot_ready",*(void **)((long)slots + 0xe8),
                                (long)*(int *)((long)slots + 0x20) * 0x38);
      *(void **)((long)slots + 0xe8) = pvVar4;
      if (pvVar4 == (void *)0x0) {
        _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,"impl->slots",
                   "mpp_buf_slot_ready",0x3bb);
        if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0012d96d;
      }
      init_slot_entry((MppBufSlotsImpl *)slots,0,*(RK_S32 *)((long)slots + 0x20));
      iVar2 = *(int *)((long)slots + 0x20);
    }
    *(int *)((long)slots + 0x60) = iVar2;
    mpp_frame_copy(*(MppFrame *)((long)slots + 0x90),*(MppFrame *)((long)slots + 0x98));
    lVar1 = *(long *)((long)slots + 0xe0);
    if (lVar1 != 0) {
      *(undefined4 *)(lVar1 + 0x2a) = 0;
      *(undefined2 *)(lVar1 + 0x2e) = 0;
    }
    *(undefined8 *)((long)slots + 0x18) = 0xffffffff00000000;
    Mutex::Autolock::~Autolock(&auto_lock);
    MVar3 = MPP_OK;
  }
  return MVar3;
}

Assistant:

MPP_RET mpp_buf_slot_ready(MppBufSlots slots)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    buf_slot_dbg(BUF_SLOT_DBG_SETUP, "slot %p is ready now\n", slots);

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    slot_assert(impl, impl->slots);
    if (!impl->info_changed)
        mpp_log("found info change ready set without internal info change\n");

    // ready mean the info_set will be copy to info as the new configuration
    if (impl->buf_count != impl->new_count) {
        impl->slots = mpp_realloc(impl->slots, MppBufSlotEntry, impl->new_count);
        mpp_assert(impl->slots);
        init_slot_entry(impl, 0, impl->new_count);
    }
    impl->buf_count = impl->new_count;

    mpp_frame_copy(impl->info, impl->info_set);

    if (impl->logs)
        buf_slot_logs_reset(impl->logs);

    impl->info_changed = 0;
    impl->info_change_slot_idx = -1;
    return MPP_OK;
}